

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O0

REF_STATUS ref_oct_export_tet(REF_OCT ref_oct,REF_INT node,REF_GRID ref_grid,REF_INT *tri_nodes)

{
  REF_INT local_ac;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT new_cell;
  REF_INT tet_nodes [27];
  REF_CELL ref_cell;
  REF_INT *tri_nodes_local;
  REF_GRID ref_grid_local;
  REF_INT node_local;
  REF_OCT ref_oct_local;
  
  unique0x00012000 = ref_grid->cell[8];
  ref_private_macro_code_rsb = ref_oct->nodes[*tri_nodes + node * 0x1b];
  new_cell = ref_oct->nodes[tri_nodes[1] + node * 0x1b];
  tet_nodes[0] = ref_oct->nodes[tri_nodes[2] + node * 0x1b];
  tet_nodes[1] = ref_oct->nodes[node * 0x1b + 0x1a];
  ref_oct_local._4_4_ = ref_cell_add(unique0x00012000,&ref_private_macro_code_rsb,&local_ac);
  if (ref_oct_local._4_4_ == 0) {
    ref_oct_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x376,
           "ref_oct_export_tet",(ulong)ref_oct_local._4_4_,"add tri tet");
    printf("tri %d %d %d tet %d %d %d %d\n",(ulong)(uint)*tri_nodes,(ulong)(uint)tri_nodes[1],
           (ulong)(uint)tri_nodes[2],(ulong)(uint)ref_private_macro_code_rsb,(ulong)(uint)new_cell,
           tet_nodes[0],tet_nodes[1]);
  }
  return ref_oct_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_export_tet(REF_OCT ref_oct, REF_INT node,
                                             REF_GRID ref_grid,
                                             REF_INT *tri_nodes) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
  tet_nodes[0] = ref_oct_c2n(ref_oct, tri_nodes[0], node);
  tet_nodes[1] = ref_oct_c2n(ref_oct, tri_nodes[1], node);
  tet_nodes[2] = ref_oct_c2n(ref_oct, tri_nodes[2], node);
  tet_nodes[3] = ref_oct_c2n(ref_oct, 26, node);
  RSB(ref_cell_add(ref_cell, tet_nodes, &new_cell), "add tri tet", {
    printf("tri %d %d %d tet %d %d %d %d\n", tri_nodes[0], tri_nodes[1],
           tri_nodes[2], tet_nodes[0], tet_nodes[1], tet_nodes[2],
           tet_nodes[3]);
  });
  return REF_SUCCESS;
}